

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,true>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  hugeint_t *phVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  hugeint_t hVar11;
  hugeint_t local_88;
  hugeint_t *local_78;
  hugeint_t *local_70;
  hugeint_t local_68;
  idx_t local_58;
  ulong local_50;
  uint64_t local_48;
  int64_t iStack_40;
  ValidityMask *local_38;
  
  local_78 = ldata;
  local_70 = rdata;
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_48 = rdata->lower;
      iStack_40 = rdata->upper;
      lVar9 = 0;
      do {
        puVar1 = (uint64_t *)((long)&local_78->lower + lVar9);
        local_88.lower = *puVar1;
        local_88.upper = puVar1[1];
        local_68.lower = local_48;
        local_68.upper = iStack_40;
        hVar11 = hugeint_t::operator+(&local_88,&local_68);
        *(uint64_t *)((long)&result_data->lower + lVar9) = hVar11.lower;
        *(int64_t *)((long)&result_data->upper + lVar9) = hVar11.upper;
        lVar9 = lVar9 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    uVar7 = 0;
    uVar6 = 0;
    local_58 = count;
    do {
      phVar4 = local_78;
      puVar2 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
LAB_00959a27:
        uVar5 = uVar7;
        if (uVar7 < uVar8) {
          local_48 = local_70->lower;
          iStack_40 = local_70->upper;
          lVar9 = uVar7 << 4;
          do {
            puVar1 = (uint64_t *)((long)&phVar4->lower + lVar9);
            local_88.lower = *puVar1;
            local_88.upper = puVar1[1];
            local_68.lower = local_48;
            local_68.upper = iStack_40;
            hVar11 = hugeint_t::operator+(&local_88,&local_68);
            *(uint64_t *)((long)&result_data->lower + lVar9) = hVar11.lower;
            *(int64_t *)((long)&result_data->upper + lVar9) = hVar11.upper;
            uVar7 = uVar7 + 1;
            lVar9 = lVar9 + 0x10;
            uVar5 = uVar8;
            count = local_58;
          } while (uVar8 != uVar7);
        }
      }
      else {
        uVar3 = puVar2[uVar6];
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
        uVar5 = uVar8;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_00959a27;
          uVar5 = uVar7;
          if (uVar7 < uVar8) {
            lVar9 = uVar7 << 4;
            uVar10 = 0;
            do {
              if ((uVar3 >> (uVar10 & 0x3f) & 1) != 0) {
                puVar1 = (uint64_t *)((long)&local_78->lower + lVar9);
                local_88.lower = *puVar1;
                local_88.upper = puVar1[1];
                local_68.lower = local_70->lower;
                local_68.upper = local_70->upper;
                hVar11 = hugeint_t::operator+(&local_88,&local_68);
                *(uint64_t *)((long)&result_data->lower + lVar9) = hVar11.lower;
                *(int64_t *)((long)&result_data->upper + lVar9) = hVar11.upper;
              }
              uVar10 = uVar10 + 1;
              lVar9 = lVar9 + 0x10;
              uVar5 = uVar8;
              count = local_58;
            } while (uVar8 - uVar7 != uVar10);
          }
        }
      }
      uVar7 = uVar5;
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}